

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

int av1_init_parallel_frame_context
              (AV1_COMP_DATA *first_cpi_data,AV1_PRIMARY *ppi,int *ref_buffers_used_map)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  AV1_COMP *cpi;
  RefCntBuffer *pRVar5;
  AV1_COMP *cpi_00;
  BufferPool *pBVar6;
  int64_t iVar7;
  RefCntBuffer *pRVar8;
  RefCntBuffer *pRVar9;
  RefCntBuffer *pRVar10;
  RefCntBuffer *pRVar11;
  RefCntBuffer *pRVar12;
  RefCntBuffer *pRVar13;
  undefined1 auVar14 [16];
  int iVar15;
  int iVar16;
  undefined1 *puVar17;
  lookahead_entry *plVar18;
  RefCntBuffer **ppRVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  bool bVar28;
  bool bVar29;
  RefFrameMapPair first_ref_frame_map_pairs [8];
  RefFrameMapPair ref_frame_map_pairs [8];
  uint local_104;
  int local_fc;
  int local_f8;
  FIRSTPASS_STATS *local_e8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  RefFrameMapPair local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  cpi = ppi->cpi;
  bVar2 = cpi->gf_frame_index;
  uVar20 = (ulong)bVar2;
  local_104 = (cpi->common).current_frame.frame_number;
  iVar21 = (cpi->frame_index_set).show_frame_count;
  local_f8 = (cpi->rc).frames_since_key;
  local_fc = (cpi->rc).frames_to_key;
  iVar23 = (cpi->rc).frames_to_fwd_kf;
  bVar3 = (ppi->gf_group).arf_src_offset[uVar20];
  local_e8 = (cpi->twopass_frame).stats_in;
  pRVar5 = (cpi->common).cur_frame;
  if (pRVar5 != (RefCntBuffer *)0x0) {
    pRVar5->ref_count = pRVar5->ref_count + -1;
    (cpi->common).cur_frame = (RefCntBuffer *)0x0;
  }
  if ((cpi->ppi->gf_group).update_type[uVar20] == '\0') {
    local_88._8_4_ = 0xffffffff;
    local_88._0_8_ = 0xffffffffffffffff;
    local_88._12_4_ = 0xffffffff;
    local_98._8_4_ = 0xffffffff;
    local_98._0_8_ = 0xffffffffffffffff;
    local_98._12_4_ = 0xffffffff;
    local_a8._8_4_ = 0xffffffff;
    local_a8._0_8_ = 0xffffffffffffffff;
    local_a8._12_4_ = 0xffffffff;
    local_b8._8_4_ = 0xffffffff;
    local_b8._0_8_ = 0xffffffffffffffff;
    local_b8._12_4_ = 0xffffffff;
  }
  else {
    puVar17 = local_b8 + 0xc;
    local_88 = (undefined1  [16])0x0;
    local_98 = (undefined1  [16])0x0;
    local_a8 = (undefined1  [16])0x0;
    local_b8 = (undefined1  [16])0x0;
    ppRVar19 = (cpi->common).ref_frame_map;
    lVar22 = 1;
    uVar24 = 0;
    do {
      ppRVar19 = ppRVar19 + 1;
      uVar26 = 6;
      if (6 < uVar24) {
        uVar26 = uVar24;
      }
      if (*(int *)(local_b8 + uVar24 * 8 + 4) != -1) {
        pRVar5 = (cpi->common).ref_frame_map[uVar24];
        if (pRVar5 == (RefCntBuffer *)0x0) {
          *(undefined4 *)(local_b8 + uVar24 * 8 + 4) = 0xffffffff;
          uVar25 = 0xffffffff;
        }
        else {
          if ((uVar24 != 7) && (1 < pRVar5->ref_count)) {
            lVar27 = 0;
            do {
              if (ppRVar19[lVar27] == pRVar5) {
                *(undefined8 *)(puVar17 + lVar27 * 8 + -4) = 0xffffffffffffffff;
              }
              lVar27 = lVar27 + 1;
            } while (uVar26 + lVar22 != lVar27);
          }
          *(uint *)(local_b8 + uVar24 * 8 + 4) = pRVar5->display_order_hint;
          uVar25 = pRVar5->pyramid_level;
        }
        *(uint *)(local_b8 + uVar24 * 8) = uVar25;
      }
      uVar24 = uVar24 + 1;
      puVar17 = puVar17 + 8;
      lVar22 = lVar22 + -1;
    } while (uVar24 != 8);
  }
  auVar14 = local_b8;
  local_48 = local_88._0_8_;
  uStack_40 = local_88._8_8_;
  local_58 = local_98._0_8_;
  uStack_50 = local_98._8_8_;
  local_68 = local_a8._0_8_;
  uStack_60 = local_a8._8_8_;
  local_78.pyr_level = local_b8._0_4_;
  local_78.disp_order = local_b8._4_4_;
  uStack_70 = local_b8._8_8_;
  local_b8 = auVar14;
  if ((ppi->gf_group).update_type[uVar20] == '\x06') {
    iVar15 = av1_calc_refresh_idx_for_intnl_arf(cpi,&local_78,(uint)bVar2);
    cpi->ref_refresh_index = iVar15;
    cpi->refresh_idx_available = true;
    (&local_78)[iVar15].disp_order = (ppi->gf_group).display_idx[uVar20];
    (&local_78)[iVar15].pyr_level = (ppi->gf_group).layer_depth[uVar20];
  }
  cpi->do_frame_data_update = false;
  if ((ppi->gf_group).arf_src_offset[uVar20] == '\0') {
    iVar7 = ppi->ts_end_last_show_frame;
    (cpi->time_stamps).prev_ts_start = ppi->ts_start_last_show_frame;
    (cpi->time_stamps).prev_ts_end = iVar7;
  }
  av1_get_ref_frames((RefFrameMapPair *)local_b8,bVar3 + local_104,cpi,(uint)bVar2,1,
                     (cpi->common).remapped_ref_idx);
  scale_references_fpmt(cpi,ref_buffers_used_map);
  iVar15 = 1;
  if ((int)(bVar2 + 1) < (ppi->gf_group).size) {
    uVar24 = uVar20 + 1;
    lVar22 = uVar20 + 0xc61;
    iVar15 = 1;
    do {
      if (*(char *)((long)ppi + lVar22 + -0x9d7) == '\0') {
        if (iVar23 < 1) {
          iVar23 = (cpi->oxcf).kf_cfg.fwd_kf_dist;
        }
        local_104 = local_104 + 1;
        iVar21 = iVar21 + 1;
        bVar29 = local_fc != 0;
        bVar28 = local_fc == 0;
        local_fc = local_fc + -1;
        if (bVar28) {
          local_fc = 0;
        }
        iVar23 = iVar23 - (uint)bVar29;
        local_f8 = local_f8 + (uint)bVar29;
        local_e8 = local_e8 + 1;
      }
      if (*(int *)((long)ppi->parallel_cpi + lVar22 * 4 + -4) == 2) {
        bVar2 = *(byte *)((long)ppi + lVar22 + -0x9d6);
        cpi_00 = ppi->parallel_cpi[iVar15];
        cpi_00->gf_frame_index = (char)lVar22 + 0xa0;
        cpi_00->framerate = cpi->framerate;
        (cpi_00->common).current_frame.frame_number = local_104;
        (cpi_00->common).current_frame.frame_type =
             *(FRAME_TYPE *)((long)(ppi->gf_group).arf_boost + lVar22 + 0x348);
        (cpi_00->frame_index_set).show_frame_count = iVar21;
        (cpi_00->rc).frames_since_key = local_f8;
        (cpi_00->rc).frames_to_key = local_fc;
        (cpi_00->rc).frames_to_fwd_kf = iVar23;
        (cpi_00->rc).active_worst_quality = (cpi->rc).active_worst_quality;
        (cpi_00->rc).max_frame_bandwidth = (cpi->rc).max_frame_bandwidth;
        iVar16 = (cpi->rc).min_frame_bandwidth;
        (cpi_00->rc).avg_frame_bandwidth = (cpi->rc).avg_frame_bandwidth;
        (cpi_00->rc).min_frame_bandwidth = iVar16;
        (cpi_00->rc).intervals_till_gf_calculate_due = (cpi->rc).intervals_till_gf_calculate_due;
        (cpi_00->mv_search_params).max_mv_magnitude = (cpi->mv_search_params).max_mv_magnitude;
        if ((ppi->gf_group).update_type[uVar24 & 0xff] == '\x06') {
          (cpi_00->common).lf.mode_ref_delta_enabled = '\x01';
        }
        cpi_00->do_frame_data_update = false;
        if (*(char *)((long)ppi + lVar22 + -0x9d6) == '\0') {
          plVar18 = av1_lookahead_peek(ppi->lookahead,
                                       *(int *)((long)ppi + lVar22 * 4 + -0x1774) + -1,
                                       cpi_00->compressor_stage);
          iVar7 = plVar18->ts_end;
          (cpi_00->time_stamps).prev_ts_start = plVar18->ts_start;
          (cpi_00->time_stamps).prev_ts_end = iVar7;
        }
        iVar16 = iVar15 + -1;
        (cpi_00->time_stamps).first_ts_start = (cpi->time_stamps).first_ts_start;
        pRVar5 = (cpi->common).ref_frame_map[1];
        pRVar8 = (cpi->common).ref_frame_map[2];
        pRVar9 = (cpi->common).ref_frame_map[3];
        pRVar10 = (cpi->common).ref_frame_map[4];
        pRVar11 = (cpi->common).ref_frame_map[5];
        pRVar12 = (cpi->common).ref_frame_map[6];
        pRVar13 = (cpi->common).ref_frame_map[7];
        (cpi_00->common).ref_frame_map[0] = (cpi->common).ref_frame_map[0];
        (cpi_00->common).ref_frame_map[1] = pRVar5;
        (cpi_00->common).ref_frame_map[2] = pRVar8;
        (cpi_00->common).ref_frame_map[3] = pRVar9;
        (cpi_00->common).ref_frame_map[4] = pRVar10;
        (cpi_00->common).ref_frame_map[5] = pRVar11;
        (cpi_00->common).ref_frame_map[6] = pRVar12;
        (cpi_00->common).ref_frame_map[7] = pRVar13;
        ppi->parallel_frames_data[iVar16].lib_flags = 0;
        ppi->parallel_frames_data[iVar16].timestamp_ratio = first_cpi_data->timestamp_ratio;
        ppi->parallel_frames_data[iVar16].flush = first_cpi_data->flush;
        ppi->parallel_frames_data[iVar16].frame_size = 0;
        if ((ppi->gf_group).update_type[uVar20] == '\x06') {
          ppi->parallel_frames_data[iVar16].lib_flags = first_cpi_data->lib_flags;
          iVar16 = av1_calc_refresh_idx_for_intnl_arf(cpi_00,&local_78,(int)uVar24);
          cpi_00->ref_refresh_index = iVar16;
          cpi_00->refresh_idx_available = true;
          cpi_00->ref_idx_to_skip = cpi->ref_refresh_index;
        }
        else {
          cpi_00->ref_idx_to_skip = -1;
          cpi_00->ref_refresh_index = -1;
          cpi_00->refresh_idx_available = false;
        }
        (cpi_00->twopass_frame).stats_in = local_e8;
        av1_get_ref_frames((RefFrameMapPair *)local_b8,bVar2 + local_104,cpi_00,(int)uVar24,1,
                           (cpi_00->common).remapped_ref_idx);
        scale_references_fpmt(cpi_00,ref_buffers_used_map);
        iVar15 = iVar15 + 1;
      }
      if ((uVar24 == (ppi->gf_group).size - 1) ||
         (((iVar16 = *(int *)((long)ppi->parallel_cpi + lVar22 * 4), iVar16 == 0 &&
           ((cVar4 = *(char *)((long)ppi + lVar22 + -0xacf), cVar4 == '\x03' || (cVar4 == '\x06'))))
          || (iVar16 == 1)))) {
        ppi->parallel_cpi[(long)iVar15 + -1]->do_frame_data_update = true;
        break;
      }
      uVar24 = uVar24 + 1;
      lVar22 = lVar22 + 1;
    } while ((long)uVar24 < (long)(ppi->gf_group).size);
  }
  pBVar6 = (cpi->common).buffer_pool;
  uVar20 = (ulong)pBVar6->num_frame_bufs;
  if (uVar20 != 0) {
    uVar25 = *ref_buffers_used_map;
    lVar22 = 0;
    uVar24 = 0;
    do {
      if ((uVar25 >> ((uint)uVar24 & 0x1f) & 1) != 0) {
        piVar1 = (int *)((long)pBVar6->frame_bufs->ref_order_hints + lVar22 + -8);
        *piVar1 = *piVar1 + 1;
      }
      uVar24 = uVar24 + 1;
      lVar22 = lVar22 + 0x58e0;
    } while (uVar20 != uVar24);
  }
  return iVar15;
}

Assistant:

int av1_init_parallel_frame_context(const AV1_COMP_DATA *const first_cpi_data,
                                    AV1_PRIMARY *const ppi,
                                    int *ref_buffers_used_map) {
  AV1_COMP *const first_cpi = ppi->cpi;
  GF_GROUP *const gf_group = &ppi->gf_group;
  int gf_index_start = first_cpi->gf_frame_index;
  assert(gf_group->frame_parallel_level[gf_index_start] == 1);
  int parallel_frame_count = 0;
  int cur_frame_num = first_cpi->common.current_frame.frame_number;
  int show_frame_count = first_cpi->frame_index_set.show_frame_count;
  int frames_since_key = first_cpi->rc.frames_since_key;
  int frames_to_key = first_cpi->rc.frames_to_key;
  int frames_to_fwd_kf = first_cpi->rc.frames_to_fwd_kf;
  int cur_frame_disp = cur_frame_num + gf_group->arf_src_offset[gf_index_start];
  const FIRSTPASS_STATS *stats_in = first_cpi->twopass_frame.stats_in;

  assert(*ref_buffers_used_map == 0);

  // Release the previously used frame-buffer by a frame_parallel_level 1 frame.
  if (first_cpi->common.cur_frame != NULL) {
    --first_cpi->common.cur_frame->ref_count;
    first_cpi->common.cur_frame = NULL;
  }

  RefFrameMapPair ref_frame_map_pairs[REF_FRAMES];
  RefFrameMapPair first_ref_frame_map_pairs[REF_FRAMES];
  init_ref_map_pair(first_cpi, first_ref_frame_map_pairs);
  memcpy(ref_frame_map_pairs, first_ref_frame_map_pairs,
         sizeof(RefFrameMapPair) * REF_FRAMES);

  // Store the reference refresh index of frame_parallel_level 1 frame in a
  // parallel encode set of lower layer frames.
  if (gf_group->update_type[gf_index_start] == INTNL_ARF_UPDATE) {
    first_cpi->ref_refresh_index = av1_calc_refresh_idx_for_intnl_arf(
        first_cpi, ref_frame_map_pairs, gf_index_start);
    assert(first_cpi->ref_refresh_index != INVALID_IDX &&
           first_cpi->ref_refresh_index < REF_FRAMES);
    first_cpi->refresh_idx_available = true;
    // Update ref_frame_map_pairs.
    ref_frame_map_pairs[first_cpi->ref_refresh_index].disp_order =
        gf_group->display_idx[gf_index_start];
    ref_frame_map_pairs[first_cpi->ref_refresh_index].pyr_level =
        gf_group->layer_depth[gf_index_start];
  }

  // Set do_frame_data_update flag as false for frame_parallel_level 1 frame.
  first_cpi->do_frame_data_update = false;
  if (gf_group->arf_src_offset[gf_index_start] == 0) {
    first_cpi->time_stamps.prev_ts_start = ppi->ts_start_last_show_frame;
    first_cpi->time_stamps.prev_ts_end = ppi->ts_end_last_show_frame;
  }

  av1_get_ref_frames(first_ref_frame_map_pairs, cur_frame_disp, first_cpi,
                     gf_index_start, 1, first_cpi->common.remapped_ref_idx);

  scale_references_fpmt(first_cpi, ref_buffers_used_map);
  parallel_frame_count++;

  // Iterate through the GF_GROUP to find the remaining frame_parallel_level 2
  // frames which are part of the current parallel encode set and initialize the
  // required cpi elements.
  for (int i = gf_index_start + 1; i < gf_group->size; i++) {
    // Update frame counters if previous frame was show frame or show existing
    // frame.
    if (gf_group->arf_src_offset[i - 1] == 0) {
      cur_frame_num++;
      show_frame_count++;
      if (frames_to_fwd_kf <= 0)
        frames_to_fwd_kf = first_cpi->oxcf.kf_cfg.fwd_kf_dist;
      if (frames_to_key) {
        frames_since_key++;
        frames_to_key--;
        frames_to_fwd_kf--;
      }
      stats_in++;
    }
    cur_frame_disp = cur_frame_num + gf_group->arf_src_offset[i];
    if (gf_group->frame_parallel_level[i] == 2) {
      AV1_COMP *cur_cpi = ppi->parallel_cpi[parallel_frame_count];
      AV1_COMP_DATA *cur_cpi_data =
          &ppi->parallel_frames_data[parallel_frame_count - 1];
      cur_cpi->gf_frame_index = i;
      cur_cpi->framerate = first_cpi->framerate;
      cur_cpi->common.current_frame.frame_number = cur_frame_num;
      cur_cpi->common.current_frame.frame_type = gf_group->frame_type[i];
      cur_cpi->frame_index_set.show_frame_count = show_frame_count;
      cur_cpi->rc.frames_since_key = frames_since_key;
      cur_cpi->rc.frames_to_key = frames_to_key;
      cur_cpi->rc.frames_to_fwd_kf = frames_to_fwd_kf;
      cur_cpi->rc.active_worst_quality = first_cpi->rc.active_worst_quality;
      cur_cpi->rc.avg_frame_bandwidth = first_cpi->rc.avg_frame_bandwidth;
      cur_cpi->rc.max_frame_bandwidth = first_cpi->rc.max_frame_bandwidth;
      cur_cpi->rc.min_frame_bandwidth = first_cpi->rc.min_frame_bandwidth;
      cur_cpi->rc.intervals_till_gf_calculate_due =
          first_cpi->rc.intervals_till_gf_calculate_due;
      cur_cpi->mv_search_params.max_mv_magnitude =
          first_cpi->mv_search_params.max_mv_magnitude;
      if (gf_group->update_type[cur_cpi->gf_frame_index] == INTNL_ARF_UPDATE) {
        cur_cpi->common.lf.mode_ref_delta_enabled = 1;
      }
      cur_cpi->do_frame_data_update = false;
      // Initialize prev_ts_start and prev_ts_end for show frame(s) and show
      // existing frame(s).
      if (gf_group->arf_src_offset[i] == 0) {
        // Choose source of prev frame.
        int src_index = gf_group->src_offset[i];
        struct lookahead_entry *prev_source = av1_lookahead_peek(
            ppi->lookahead, src_index - 1, cur_cpi->compressor_stage);
        // Save timestamps of prev frame.
        cur_cpi->time_stamps.prev_ts_start = prev_source->ts_start;
        cur_cpi->time_stamps.prev_ts_end = prev_source->ts_end;
      }
      cur_cpi->time_stamps.first_ts_start =
          first_cpi->time_stamps.first_ts_start;

      memcpy(cur_cpi->common.ref_frame_map, first_cpi->common.ref_frame_map,
             sizeof(first_cpi->common.ref_frame_map));
      cur_cpi_data->lib_flags = 0;
      cur_cpi_data->timestamp_ratio = first_cpi_data->timestamp_ratio;
      cur_cpi_data->flush = first_cpi_data->flush;
      cur_cpi_data->frame_size = 0;
      if (gf_group->update_type[gf_index_start] == INTNL_ARF_UPDATE) {
        // If the first frame in a parallel encode set is INTNL_ARF_UPDATE
        // frame, initialize lib_flags of frame_parallel_level 2 frame in the
        // set with that of frame_parallel_level 1 frame.
        cur_cpi_data->lib_flags = first_cpi_data->lib_flags;
        // Store the reference refresh index of frame_parallel_level 2 frame in
        // a parallel encode set of lower layer frames.
        cur_cpi->ref_refresh_index =
            av1_calc_refresh_idx_for_intnl_arf(cur_cpi, ref_frame_map_pairs, i);
        cur_cpi->refresh_idx_available = true;
        // Skip the reference frame which will be refreshed by
        // frame_parallel_level 1 frame in a parallel encode set of lower layer
        // frames.
        cur_cpi->ref_idx_to_skip = first_cpi->ref_refresh_index;
      } else {
        cur_cpi->ref_idx_to_skip = INVALID_IDX;
        cur_cpi->ref_refresh_index = INVALID_IDX;
        cur_cpi->refresh_idx_available = false;
      }
      cur_cpi->twopass_frame.stats_in = stats_in;

      av1_get_ref_frames(first_ref_frame_map_pairs, cur_frame_disp, cur_cpi, i,
                         1, cur_cpi->common.remapped_ref_idx);
      scale_references_fpmt(cur_cpi, ref_buffers_used_map);
      parallel_frame_count++;
    }

    // Set do_frame_data_update to true for the last frame_parallel_level 2
    // frame in the current parallel encode set.
    if (i == (gf_group->size - 1) ||
        (gf_group->frame_parallel_level[i + 1] == 0 &&
         (gf_group->update_type[i + 1] == ARF_UPDATE ||
          gf_group->update_type[i + 1] == INTNL_ARF_UPDATE)) ||
        gf_group->frame_parallel_level[i + 1] == 1) {
      ppi->parallel_cpi[parallel_frame_count - 1]->do_frame_data_update = true;
      break;
    }
  }

  increment_scaled_ref_counts_fpmt(first_cpi->common.buffer_pool,
                                   *ref_buffers_used_map);

  // Return the number of frames in the parallel encode set.
  return parallel_frame_count;
}